

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O3

QPDFNumberTreeObjectHelper *
QPDFNumberTreeObjectHelper::newEmpty
          (QPDFNumberTreeObjectHelper *__return_storage_ptr__,QPDF *qpdf,bool auto_repair)

{
  QPDFObjectHandle local_40;
  char local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  operator____qpdf(local_30,0x27a4c4);
  QPDF::makeIndirectObject((QPDF *)&local_40,(QPDFObjectHandle *)qpdf);
  QPDFNumberTreeObjectHelper(__return_storage_ptr__,&local_40,qpdf,auto_repair);
  if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFNumberTreeObjectHelper
QPDFNumberTreeObjectHelper::newEmpty(QPDF& qpdf, bool auto_repair)
{
    return {qpdf.makeIndirectObject("<< /Nums [] >>"_qpdf), qpdf, auto_repair};
}